

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiheadattention_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::MultiHeadAttention_x86_avx512::forward
          (MultiHeadAttention_x86_avx512 *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *_opt)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  pointer pMVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int *piVar9;
  size_t sVar10;
  long lVar11;
  Allocator *pAVar12;
  Allocator *pAVar13;
  int iVar14;
  int iVar15;
  int _w;
  int iVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  pointer pMVar20;
  pointer pMVar21;
  long lVar22;
  int *piVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  Option opt1;
  long local_328;
  Mat local_318;
  long local_2d0;
  Mat local_2c8;
  MultiHeadAttention_x86_avx512 *local_280;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_bottom_blobs;
  Mat local_228;
  void *local_1d8;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  int local_1c0;
  Allocator *local_1b8;
  undefined4 uStack_1b0;
  int iStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_1a0;
  undefined8 local_198;
  void *local_188;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  Allocator *local_168;
  undefined4 uStack_160;
  int iStack_15c;
  undefined4 uStack_158;
  undefined4 uStack_154;
  undefined4 local_150;
  undefined8 local_148;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_140;
  pointer local_138;
  int *local_130;
  vector<int,_std::allocator<int>_> retqkvs;
  vector<int,_std::allocator<int>_> retqks;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_bottom_blobs;
  Option opt;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qkv_top_blobs;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> qk_top_blobs;
  
  pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar17 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)pMVar6;
  local_138 = pMVar6;
  if (lVar17 == 0x48) {
    iVar16 = (this->super_MultiHeadAttention).attn_mask;
    pMVar20 = pMVar6;
LAB_004bc7b8:
    pMVar21 = pMVar20;
    if (iVar16 != 0) goto LAB_004bc800;
    local_2c8.cstep = 0;
    local_2c8.data = (void *)0x0;
    local_2c8.refcount._0_4_ = 0;
    local_2c8.refcount._4_4_ = 0;
    local_2c8.elemsize._0_4_ = 0;
    local_2c8.elemsize._4_4_ = 0;
    local_2c8.elempack = 0;
    local_2c8.allocator = (Allocator *)0x0;
    local_2c8.dims = 0;
    local_2c8.w = 0;
    local_2c8.h = 0;
    local_2c8.d = 0;
    local_2c8.c = 0;
  }
  else {
    iVar16 = (this->super_MultiHeadAttention).attn_mask;
    pMVar20 = pMVar6 + 1;
    pMVar21 = pMVar6;
    if (iVar16 == 0 || lVar17 != 0x90) {
      local_138 = pMVar20;
      if (iVar16 == 0) {
        local_138 = pMVar6 + 2;
      }
      if (lVar17 != 0xd8) {
        local_138 = pMVar6 + 2;
      }
      if (lVar17 == 0x90) {
        local_138 = pMVar20;
      }
      goto LAB_004bc7b8;
    }
LAB_004bc800:
    piVar23 = *(int **)((long)pMVar6 + lVar17 + -0x40);
    plVar1 = (long *)((long)pMVar6 + lVar17 + -0x48);
    local_2c8.data = (void *)*plVar1;
    lVar24 = plVar1[1];
    local_2c8.refcount._0_4_ = (undefined4)lVar24;
    local_2c8.refcount._4_4_ = (undefined4)((ulong)lVar24 >> 0x20);
    uVar7 = *(undefined8 *)((long)pMVar6 + lVar17 + -0x38);
    local_2c8.elemsize._0_4_ = (undefined4)uVar7;
    local_2c8.elemsize._4_4_ = (undefined4)((ulong)uVar7 >> 0x20);
    local_2c8.elempack = *(int *)((long)pMVar6 + lVar17 + -0x30);
    local_2c8.allocator = *(Allocator **)((long)pMVar6 + lVar17 + -0x28);
    puVar2 = (undefined8 *)((long)pMVar6 + lVar17 + -0x20);
    uVar7 = *puVar2;
    uVar8 = puVar2[1];
    local_2c8.dims = (int)uVar7;
    local_2c8.w = (int)((ulong)uVar7 >> 0x20);
    local_2c8.h = (int)uVar8;
    local_2c8.d = (int)((ulong)uVar8 >> 0x20);
    local_2c8.c = *(int *)((long)pMVar6 + lVar17 + -0x10);
    local_2c8.cstep = *(size_t *)((long)pMVar6 + lVar17 + -8);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + 1;
      UNLOCK();
    }
  }
  piVar23 = &(this->super_MultiHeadAttention).attn_mask;
  opt.lightmode = _opt->lightmode;
  opt.use_shader_pack8 = _opt->use_shader_pack8;
  opt.use_subgroup_ops = _opt->use_subgroup_ops;
  opt.use_reserved_0 = _opt->use_reserved_0;
  opt.num_threads = _opt->num_threads;
  opt.blob_allocator = _opt->blob_allocator;
  opt.workspace_allocator = _opt->workspace_allocator;
  opt.openmp_blocktime = _opt->openmp_blocktime;
  opt.use_winograd_convolution = _opt->use_winograd_convolution;
  opt.use_sgemm_convolution = _opt->use_sgemm_convolution;
  opt.use_int8_inference = _opt->use_int8_inference;
  opt.use_vulkan_compute = _opt->use_vulkan_compute;
  opt.use_bf16_storage = _opt->use_bf16_storage;
  opt.use_fp16_packed = _opt->use_fp16_packed;
  opt.use_fp16_storage = _opt->use_fp16_storage;
  opt.use_fp16_arithmetic = _opt->use_fp16_arithmetic;
  opt.use_int8_packed = _opt->use_int8_packed;
  opt.use_int8_storage = _opt->use_int8_storage;
  opt.use_int8_arithmetic = _opt->use_int8_arithmetic;
  opt.use_packing_layout = _opt->use_packing_layout;
  opt.vulkan_device_index = _opt->vulkan_device_index;
  opt.use_reserved_1 = _opt->use_reserved_1;
  opt.use_image_storage = _opt->use_image_storage;
  opt.use_tensor_storage = _opt->use_tensor_storage;
  opt.use_reserved_2 = _opt->use_reserved_2;
  opt.flush_denormals = _opt->flush_denormals;
  opt.use_local_pool_allocator = _opt->use_local_pool_allocator;
  opt.use_shader_local_memory = _opt->use_shader_local_memory;
  opt.use_cooperative_matrix = _opt->use_cooperative_matrix;
  opt.use_winograd23_convolution = _opt->use_winograd23_convolution;
  opt.use_winograd43_convolution = _opt->use_winograd43_convolution;
  opt.use_winograd63_convolution = _opt->use_winograd63_convolution;
  opt.use_a53_a55_optimized_kernel = _opt->use_a53_a55_optimized_kernel;
  opt.use_fp16_uniform = _opt->use_fp16_uniform;
  opt.use_int8_uniform = _opt->use_int8_uniform;
  opt.use_reserved_9 = _opt->use_reserved_9;
  opt.use_reserved_10 = _opt->use_reserved_10;
  opt.use_reserved_11 = _opt->use_reserved_11;
  if ((this->super_MultiHeadAttention).int8_scale_term != 0) {
    opt._32_8_ = opt._32_8_ & 0xffffffffffffff;
  }
  local_318.cstep = 0;
  local_318.data = (void *)0x0;
  local_318.refcount._0_4_ = 0;
  local_318.refcount._4_4_ = 0;
  local_318.elemsize._0_4_ = 0;
  local_318.elemsize._4_4_ = 0;
  local_318.elempack = 0;
  local_318.allocator = (Allocator *)0x0;
  local_318.dims = 0;
  local_318.w = 0;
  local_318.h = 0;
  local_318.d = 0;
  local_318.c = 0;
  local_140 = top_blobs;
  if ((*piVar23 == 0) || (local_2c8.elempack == 1)) {
    piVar9 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    local_318.data = local_2c8.data;
    local_318.refcount._0_4_ = local_2c8.refcount._0_4_;
    local_318.refcount._4_4_ = local_2c8.refcount._4_4_;
    local_318.elemsize._0_4_ = (undefined4)local_2c8.elemsize;
    local_318.elemsize._4_4_ = local_2c8.elemsize._4_4_;
    local_318.elempack = local_2c8.elempack;
    local_318.allocator = local_2c8.allocator;
    local_318.dims = local_2c8.dims;
    local_318.w = local_2c8.w;
    local_318.h = local_2c8.h;
    local_318.d = local_2c8.d;
    local_318.c = local_2c8.c;
    local_318.cstep = local_2c8.cstep;
  }
  else {
    convert_packing(&local_2c8,&local_318,1,&opt);
    iVar16 = -100;
    if ((local_318.data == (void *)0x0) || ((long)local_318.c * local_318.cstep == 0))
    goto LAB_004bd01d;
  }
  iVar15 = (this->super_MultiHeadAttention).embed_dim / (this->super_MultiHeadAttention).num_heads;
  _w = pMVar6->elempack * pMVar6->h;
  iVar3 = pMVar21->elempack;
  iVar4 = pMVar21->h;
  local_148 = 0;
  local_188 = (void *)0x0;
  uStack_180 = 0;
  uStack_17c = 0;
  local_178 = 0;
  uStack_174 = 0;
  local_170 = 0;
  local_168 = (Allocator *)0x0;
  uStack_160 = 0;
  iStack_15c = 0;
  uStack_158 = 0;
  uStack_154 = 0;
  local_150 = 0;
  local_130 = piVar23;
  iVar16 = (*this->q_gemm->_vptr_Layer[7])(this->q_gemm,pMVar6,&local_188,&opt);
  if (iVar16 == 0) {
    local_198 = 0;
    local_1d8 = (void *)0x0;
    uStack_1d0 = 0;
    uStack_1cc = 0;
    local_1c8 = 0;
    uStack_1c4 = 0;
    local_1c0 = 0;
    local_1b8 = (Allocator *)0x0;
    uStack_1b0 = 0;
    iStack_1ac = 0;
    uStack_1a8 = 0;
    uStack_1a4 = 0;
    local_1a0 = 0;
    iVar16 = (*this->k_gemm->_vptr_Layer[7])(this->k_gemm,pMVar21,&local_1d8,&opt);
    if (iVar16 == 0) {
      local_228.cstep = 0;
      local_228.data = (void *)0x0;
      local_228.refcount._0_4_ = 0;
      local_228.refcount._4_4_ = 0;
      local_228.elemsize._0_4_ = 0;
      local_228.elemsize._4_4_ = 0;
      local_228.elempack = 0;
      local_228.allocator = (Allocator *)0x0;
      local_228.dims = 0;
      local_228.w = 0;
      local_228.h = 0;
      local_228.d = 0;
      local_228.c = 0;
      Mat::create(&local_228,iVar3 * iVar4,(this->super_MultiHeadAttention).num_heads * _w,4,
                  opt.blob_allocator);
      iVar16 = -100;
      if ((local_228.data != (void *)0x0) && ((long)local_228.c * local_228.cstep != 0)) {
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&retqks,(long)(this->super_MultiHeadAttention).num_heads);
        lVar17 = (long)iVar15;
        local_2d0 = (long)_w;
        local_328 = 0;
        lVar26 = 0;
        lVar24 = 0;
        local_280 = this;
        while( true ) {
          uVar5 = (this->super_MultiHeadAttention).num_heads;
          if ((int)uVar5 <= lVar24) break;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&qk_bottom_blobs,2,(allocator_type *)&opt1);
          iVar3 = iStack_15c;
          pAVar12 = local_168;
          iVar16 = local_170;
          pMVar6 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start;
          lVar22 = (long)iStack_15c;
          sVar10 = CONCAT44(uStack_174,local_178);
          pvVar25 = (void *)(lVar26 * lVar22 * sVar10 + (long)local_188);
          piVar23 = (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start)->refcount;
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              if ((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                free((qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                      _M_impl.super__Vector_impl_data._M_start)->data);
              }
              else {
                (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
              }
            }
          }
          iVar14 = iStack_1ac;
          pAVar13 = local_1b8;
          iVar4 = local_1c0;
          pMVar20 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar6->data = pvVar25;
          pMVar6->refcount = (int *)0x0;
          pMVar6->elemsize = sVar10;
          pMVar6->elempack = iVar16;
          pMVar6->allocator = pAVar12;
          pMVar6->dims = 2;
          pMVar6->w = iVar3;
          pMVar6->h = iVar15;
          pMVar6->d = 1;
          pMVar6->c = 1;
          pMVar6->cstep = lVar22 * lVar17;
          lVar22 = (long)iStack_1ac;
          sVar10 = CONCAT44(uStack_1c4,local_1c8);
          piVar23 = qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                    _M_impl.super__Vector_impl_data._M_start[1].refcount;
          pvVar25 = (void *)(lVar26 * lVar22 * sVar10 + (long)local_1d8);
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              if (qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                  super__Vector_impl_data._M_start[1].allocator == (Allocator *)0x0) {
                free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data._M_start[1].data);
              }
              else {
                (*(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                   .super__Vector_impl_data._M_start[1].allocator)->_vptr_Allocator[3])();
              }
            }
          }
          pMVar20[1].data = pvVar25;
          pMVar20[1].refcount = (int *)0x0;
          pMVar20[1].elemsize = sVar10;
          pMVar20[1].elempack = iVar4;
          pMVar20[1].allocator = pAVar13;
          pMVar20[1].dims = 2;
          pMVar20[1].w = iVar14;
          pMVar20[1].h = iVar15;
          pMVar20[1].d = 1;
          pMVar20[1].c = 1;
          pMVar20[1].cstep = lVar22 * lVar17;
          if (*local_130 != 0) {
            if (local_318.dims == 3) {
              opt1._0_8_ = local_318.cstep * lVar24 *
                           CONCAT44(local_318.elemsize._4_4_,(undefined4)local_318.elemsize) +
                           (long)local_318.data;
              opt1.blob_allocator._0_4_ = 0;
              opt1.blob_allocator._4_4_ = 0;
              opt1.use_local_pool_allocator = true;
              opt1.use_shader_local_memory = false;
              opt1.use_cooperative_matrix = false;
              opt1.use_winograd23_convolution = false;
              opt1.use_winograd43_convolution = (bool)(undefined1)local_318.d;
              opt1.use_winograd63_convolution = (bool)local_318.d._1_1_;
              opt1.use_a53_a55_optimized_kernel = (bool)local_318.d._2_1_;
              opt1.use_fp16_uniform = (bool)local_318.d._3_1_;
              opt1.vulkan_device_index = 2;
            }
            else {
              piVar23 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
              opt1._0_8_ = local_318.data;
              opt1.blob_allocator._0_4_ = local_318.refcount._0_4_;
              opt1.blob_allocator._4_4_ = local_318.refcount._4_4_;
              opt1.vulkan_device_index = local_318.dims;
              opt1.use_local_pool_allocator = (bool)(undefined1)local_318.d;
              opt1.use_shader_local_memory = (bool)local_318.d._1_1_;
              opt1.use_cooperative_matrix = (bool)local_318.d._2_1_;
              opt1.use_winograd23_convolution = (bool)local_318.d._3_1_;
              opt1.use_winograd43_convolution = (bool)(undefined1)local_318.c;
              opt1.use_winograd63_convolution = (bool)local_318.c._1_1_;
              opt1.use_a53_a55_optimized_kernel = (bool)local_318.c._2_1_;
              opt1.use_fp16_uniform = (bool)local_318.c._3_1_;
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + 1;
                UNLOCK();
              }
            }
            opt1.flush_denormals = local_318.h;
            opt1.use_reserved_1 = (bool)(undefined1)local_318.w;
            opt1.use_image_storage = (bool)local_318.w._1_1_;
            opt1.use_tensor_storage = (bool)local_318.w._2_1_;
            opt1.use_reserved_2 = (bool)local_318.w._3_1_;
            opt1._32_8_ = local_318.allocator;
            opt1.openmp_blocktime = local_318.elempack;
            opt1.workspace_allocator._4_4_ = local_318.elemsize._4_4_;
            opt1.workspace_allocator._0_4_ = (undefined4)local_318.elemsize;
            std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::push_back
                      (&qk_bottom_blobs,(value_type *)&opt1);
            piVar23 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (opt1._32_8_ == 0) {
                  free((void *)opt1._0_8_);
                }
                else {
                  (**(code **)(*(long *)opt1._32_8_ + 0x18))();
                }
              }
            }
          }
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
                    (&qk_top_blobs,1,(allocator_type *)&opt1);
          pMVar6 = qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar3 = local_228.w;
          pAVar12 = local_228.allocator;
          iVar16 = local_228.elempack;
          lVar22 = (long)local_228.w;
          sVar10 = CONCAT44(local_228.elemsize._4_4_,(undefined4)local_228.elemsize);
          pvVar25 = (void *)(local_328 * lVar22 * sVar10 + (long)local_228.data);
          piVar23 = (qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_start)->refcount;
          if (piVar23 != (int *)0x0) {
            LOCK();
            *piVar23 = *piVar23 + -1;
            UNLOCK();
            if (*piVar23 == 0) {
              if ((qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->allocator == (Allocator *)0x0) {
                free((qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                      .super__Vector_impl_data._M_start)->data);
              }
              else {
                (*(qk_top_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                   super__Vector_impl_data._M_start)->allocator->_vptr_Allocator[3])();
              }
            }
          }
          this = local_280;
          lVar11 = local_2d0;
          pMVar6->data = pvVar25;
          pMVar6->refcount = (int *)0x0;
          pMVar6->elemsize = sVar10;
          pMVar6->elempack = iVar16;
          pMVar6->allocator = pAVar12;
          pMVar6->dims = 2;
          pMVar6->w = iVar3;
          pMVar6->h = _w;
          pMVar6->d = 1;
          pMVar6->c = 1;
          pMVar6->cstep = lVar22 * local_2d0;
          opt1.blob_allocator._0_4_ = SUB84(opt.blob_allocator,0);
          opt1.blob_allocator._4_4_ = (undefined4)((ulong)opt.blob_allocator >> 0x20);
          opt1.workspace_allocator._0_4_ = SUB84(opt.workspace_allocator,0);
          opt1.workspace_allocator._4_4_ = (undefined4)((ulong)opt.workspace_allocator >> 0x20);
          opt1.openmp_blocktime = opt.openmp_blocktime;
          opt1._28_4_ = opt._28_4_;
          opt1.use_bf16_storage = opt.use_bf16_storage;
          opt1.use_fp16_packed = opt.use_fp16_packed;
          opt1.use_fp16_storage = opt.use_fp16_storage;
          opt1.use_fp16_arithmetic = opt.use_fp16_arithmetic;
          opt1.use_int8_packed = opt.use_int8_packed;
          opt1.use_int8_storage = opt.use_int8_storage;
          opt1.use_int8_arithmetic = opt.use_int8_arithmetic;
          opt1.use_packing_layout = opt.use_packing_layout;
          opt1.vulkan_device_index = opt.vulkan_device_index;
          opt1._44_4_ = opt._44_4_;
          opt1.flush_denormals = opt.flush_denormals;
          opt1._52_4_ = opt._52_4_;
          opt1._56_4_ = opt._56_4_;
          opt1._60_4_ = opt._60_4_;
          opt1._0_4_ = opt._0_4_;
          opt1.num_threads = 1;
          iVar16 = (*local_280->qk_gemm->_vptr_Layer[6])
                             (local_280->qk_gemm,&qk_bottom_blobs,&qk_top_blobs,&opt1);
          retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar24] = iVar16;
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_top_blobs);
          std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::~vector(&qk_bottom_blobs);
          lVar24 = lVar24 + 1;
          lVar26 = lVar26 + lVar17;
          local_328 = local_328 + lVar11;
        }
        uVar19 = 0;
        uVar18 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar18 = uVar19;
        }
        do {
          if (uVar18 == uVar19) {
            piVar23 = (int *)CONCAT44(uStack_17c,uStack_180);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (local_168 == (Allocator *)0x0) {
                  free(local_188);
                }
                else {
                  (*local_168->_vptr_Allocator[3])();
                }
              }
            }
            local_148 = 0;
            local_188 = (void *)0x0;
            uStack_180 = 0;
            uStack_17c = 0;
            local_178 = 0;
            uStack_174 = 0;
            local_170 = 0;
            local_150 = 0;
            uStack_160 = 0;
            iStack_15c = 0;
            uStack_158 = 0;
            uStack_154 = 0;
            piVar23 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
            if (piVar23 != (int *)0x0) {
              LOCK();
              *piVar23 = *piVar23 + -1;
              UNLOCK();
              if (*piVar23 == 0) {
                if (local_1b8 == (Allocator *)0x0) {
                  free(local_1d8);
                }
                else {
                  (*local_1b8->_vptr_Allocator[3])();
                }
              }
            }
            local_198 = 0;
            local_1d8 = (void *)0x0;
            uStack_1d0 = 0;
            uStack_1cc = 0;
            local_1c8 = 0;
            uStack_1c4 = 0;
            local_1c0 = 0;
            local_1a0 = 0;
            uStack_1b0 = 0;
            iStack_1ac = 0;
            uStack_1a8 = 0;
            uStack_1a4 = 0;
            iVar16 = (*this->qk_softmax->_vptr_Layer[9])(this->qk_softmax,&local_228,&opt);
            if (iVar16 == 0) {
              opt1.lightmode = false;
              opt1.use_shader_pack8 = false;
              opt1.use_subgroup_ops = false;
              opt1.use_reserved_0 = false;
              opt1.num_threads = 0;
              opt1.blob_allocator._0_4_ = 0;
              opt1.blob_allocator._4_4_ = 0;
              opt1.workspace_allocator._0_4_ = 0;
              opt1.workspace_allocator._4_4_ = 0;
              opt1.openmp_blocktime = 0;
              opt1.use_bf16_storage = false;
              opt1.use_fp16_packed = false;
              opt1.use_fp16_storage = false;
              opt1.use_fp16_arithmetic = false;
              opt1.use_int8_packed = false;
              opt1.use_int8_storage = false;
              opt1.use_int8_arithmetic = false;
              opt1.use_packing_layout = false;
              opt1.vulkan_device_index = 0;
              opt1.use_reserved_1 = false;
              opt1.use_image_storage = false;
              opt1.use_tensor_storage = false;
              opt1.use_reserved_2 = false;
              opt1.flush_denormals = 0;
              opt1.use_local_pool_allocator = false;
              opt1.use_shader_local_memory = false;
              opt1.use_cooperative_matrix = false;
              opt1.use_winograd23_convolution = false;
              opt1.use_winograd43_convolution = false;
              opt1.use_winograd63_convolution = false;
              opt1.use_a53_a55_optimized_kernel = false;
              opt1.use_fp16_uniform = false;
              iVar16 = (*this->v_gemm->_vptr_Layer[7])(this->v_gemm,local_138,&opt1,&opt);
              if (iVar16 == 0) {
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish._0_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
                qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
                Mat::create((Mat *)&qk_bottom_blobs,_w,
                            (this->super_MultiHeadAttention).num_heads * iVar15,4,opt.blob_allocator
                           );
                iVar16 = -100;
                piVar23 = (int *)CONCAT44(qk_bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                          qk_bottom_blobs.
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                          _M_impl.super__Vector_impl_data._M_finish._0_4_);
                if (piVar23 != (int *)0x0) {
                  LOCK();
                  *piVar23 = *piVar23 + -1;
                  UNLOCK();
                  if (*piVar23 == 0) {
                    free(qk_bottom_blobs.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                         _M_impl.super__Vector_impl_data._M_start);
                  }
                }
              }
              piVar23 = (int *)CONCAT44(opt1.blob_allocator._4_4_,opt1.blob_allocator._0_4_);
              if (piVar23 != (int *)0x0) {
                LOCK();
                *piVar23 = *piVar23 + -1;
                UNLOCK();
                if (*piVar23 == 0) {
                  if (opt1._32_8_ == 0) {
                    free((void *)opt1._0_8_);
                  }
                  else {
                    (**(code **)(*(long *)opt1._32_8_ + 0x18))();
                  }
                }
              }
            }
            break;
          }
          iVar16 = retqks.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar19];
          uVar19 = uVar19 + 1;
        } while (iVar16 == 0);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&retqks.super__Vector_base<int,_std::allocator<int>_>);
      }
      piVar23 = (int *)CONCAT44(local_228.refcount._4_4_,local_228.refcount._0_4_);
      if (piVar23 != (int *)0x0) {
        LOCK();
        *piVar23 = *piVar23 + -1;
        UNLOCK();
        if (*piVar23 == 0) {
          if (local_228.allocator == (Allocator *)0x0) {
            free(local_228.data);
          }
          else {
            (*(local_228.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar23 = (int *)CONCAT44(uStack_1cc,uStack_1d0);
    if (piVar23 != (int *)0x0) {
      LOCK();
      *piVar23 = *piVar23 + -1;
      UNLOCK();
      if (*piVar23 == 0) {
        if (local_1b8 == (Allocator *)0x0) {
          free(local_1d8);
        }
        else {
          (*local_1b8->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar23 = (int *)CONCAT44(uStack_17c,uStack_180);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_168 == (Allocator *)0x0) {
        free(local_188);
      }
      else {
        (*local_168->_vptr_Allocator[3])();
      }
    }
  }
LAB_004bd01d:
  piVar23 = (int *)CONCAT44(local_318.refcount._4_4_,local_318.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_318.allocator == (Allocator *)0x0) {
        free(local_318.data);
      }
      else {
        (*(local_318.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar23 = (int *)CONCAT44(local_2c8.refcount._4_4_,local_2c8.refcount._0_4_);
  if (piVar23 != (int *)0x0) {
    LOCK();
    *piVar23 = *piVar23 + -1;
    UNLOCK();
    if (*piVar23 == 0) {
      if (local_2c8.allocator == (Allocator *)0x0) {
        free(local_2c8.data);
      }
      else {
        (*(local_2c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int MultiHeadAttention_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& _opt) const
{
    const Mat& q_blob = bottom_blobs[0];
    const Mat& k_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : bottom_blobs[1];
    const Mat& v_blob = (bottom_blobs.size() == 1 || (bottom_blobs.size() == 2 && attn_mask)) ? q_blob : (bottom_blobs.size() == 2 || (bottom_blobs.size() == 3 && attn_mask)) ? k_blob : bottom_blobs[2];
    const Mat& attn_mask_blob = attn_mask ? bottom_blobs[bottom_blobs.size() - 1] : Mat();

    Option opt = _opt;
    if (int8_scale_term)
    {
        opt.use_packing_layout = false; // TODO enable packing
    }

    Mat attn_mask_blob_unpacked;
    if (attn_mask && attn_mask_blob.elempack != 1)
    {
        convert_packing(attn_mask_blob, attn_mask_blob_unpacked, 1, opt);
        if (attn_mask_blob_unpacked.empty())
            return -100;
    }
    else
    {
        attn_mask_blob_unpacked = attn_mask_blob;
    }

    const int embed_dim_per_head = embed_dim / num_heads;
    const int src_seqlen = q_blob.h * q_blob.elempack;
    const int dst_seqlen = k_blob.h * k_blob.elempack;

    Mat q_affine;
    int retq = q_gemm->forward(q_blob, q_affine, opt);
    if (retq != 0)
        return retq;

    Mat k_affine;
    int retk = k_gemm->forward(k_blob, k_affine, opt);
    if (retk != 0)
        return retk;

    Mat qk_cross(dst_seqlen, src_seqlen * num_heads, 4u, opt.blob_allocator);
    if (qk_cross.empty())
        return -100;

    std::vector<int> retqks;
    retqks.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qk_bottom_blobs(2);
        qk_bottom_blobs[0] = q_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        qk_bottom_blobs[1] = k_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        if (attn_mask)
        {
            const Mat& maskm = attn_mask_blob_unpacked.dims == 3 ? attn_mask_blob_unpacked.channel(i) : attn_mask_blob_unpacked;
            qk_bottom_blobs.push_back(maskm);
        }
        std::vector<Mat> qk_top_blobs(1);
        qk_top_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqks[i] = qk_gemm->forward(qk_bottom_blobs, qk_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqks[i] != 0)
            return retqks[i];
    }

    q_affine.release();
    k_affine.release();

    int retqk = qk_softmax->forward_inplace(qk_cross, opt);
    if (retqk != 0)
        return retqk;

    Mat v_affine;
    int retv = v_gemm->forward(v_blob, v_affine, opt);
    if (retv != 0)
        return retv;

    Mat qkv_cross(src_seqlen, embed_dim_per_head * num_heads, 4u, opt.blob_allocator);
    if (qkv_cross.empty())
        return -100;

    std::vector<int> retqkvs;
    retqkvs.resize(num_heads);
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < num_heads; i++)
    {
        std::vector<Mat> qkv_bottom_blobs(2);
        qkv_bottom_blobs[0] = qk_cross.row_range(i * src_seqlen, src_seqlen);
        qkv_bottom_blobs[1] = v_affine.row_range(i * embed_dim_per_head, embed_dim_per_head);
        std::vector<Mat> qkv_top_blobs(1);
        qkv_top_blobs[0] = qkv_cross.row_range(i * embed_dim_per_head, embed_dim_per_head);
        Option opt1 = opt;
        opt1.num_threads = 1;
        retqkvs[i] = qkv_gemm->forward(qkv_bottom_blobs, qkv_top_blobs, opt1);
    }
    for (int i = 0; i < num_heads; i++)
    {
        if (retqkvs[i] != 0)
            return retqkvs[i];
    }

    v_affine.release();

    int reto = o_gemm->forward(qkv_cross, top_blobs[0], opt);
    if (reto != 0)
        return reto;

    return 0;
}